

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void skiwi::anon_unknown_26::compile_prim_call_inlined
               (registered_functions *fns,environment_map *env,repl_data *rd,compile_data *data,
               asmcode *code,PrimitiveCall *prim,primitive_map *pm,compiler_options *options)

{
  int column_nr;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  pointer ppVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  operation local_cc;
  string local_c8;
  _Self local_a8;
  _Self local_a0;
  const_iterator inlined_pm_it;
  operand local_90;
  int i_2;
  ulong local_88;
  size_t i_1;
  reference pvStack_78;
  int i;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *expr;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  *__range4;
  bool expressions_can_be_targetted;
  int nr_prim_args;
  PrimitiveCall *prim_local;
  asmcode *code_local;
  compile_data *data_local;
  repl_data *rd_local;
  environment_map *env_local;
  registered_functions *fns_local;
  
  bVar1 = is_inlined_primitive(&prim->primitive_name);
  if (!bVar1) {
    __assert_fail("is_inlined_primitive(prim.primitive_name)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/compiler.cpp"
                  ,0x3da,
                  "void skiwi::(anonymous namespace)::compile_prim_call_inlined(registered_functions &, environment_map &, repl_data &, compile_data &, asmcode &, const PrimitiveCall &, const primitive_map &, const compiler_options &)"
                 );
  }
  if (((anonymous_namespace)::
       compile_prim_call_inlined(skiwi::(anonymous_namespace)::registered_functions&,std::shared_ptr<skiwi::environment<skiwi::environment_entry>>&,skiwi::repl_data&,skiwi::compile_data&,assembler::asmcode&,skiwi::PrimitiveCall_const&,std::map<std::__cxx11::string,skiwi::primitive_entry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::primitive_entry>>>const&,skiwi::compiler_options_const&)
       ::args == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   compile_prim_call_inlined(skiwi::(anonymous_namespace)::registered_functions&,std::shared_ptr<skiwi::environment<skiwi::environment_entry>>&,skiwi::repl_data&,skiwi::compile_data&,assembler::asmcode&,skiwi::PrimitiveCall_const&,std::map<std::__cxx11::string,skiwi::primitive_entry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::primitive_entry>>>const&,skiwi::compiler_options_const&)
                                   ::args), iVar2 != 0)) {
    get_inlined_args();
    __cxa_atexit(std::
                 vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
                 ~vector,&compile_prim_call_inlined::args,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         compile_prim_call_inlined(skiwi::(anonymous_namespace)::registered_functions&,std::shared_ptr<skiwi::environment<skiwi::environment_entry>>&,skiwi::repl_data&,skiwi::compile_data&,assembler::asmcode&,skiwi::PrimitiveCall_const&,std::map<std::__cxx11::string,skiwi::primitive_entry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::primitive_entry>>>const&,skiwi::compiler_options_const&)
                         ::args);
  }
  sVar3 = std::
          vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
          ::size(&prim->arguments);
  iVar2 = (int)sVar3;
  sVar3 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
          size(&compile_prim_call_inlined::args);
  if (sVar3 < (ulong)(long)iVar2) {
    __assert_fail("nr_prim_args <= args.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/compiler.cpp"
                  ,0x3e0,
                  "void skiwi::(anonymous namespace)::compile_prim_call_inlined(registered_functions &, environment_map &, repl_data &, compile_data &, asmcode &, const PrimitiveCall &, const primitive_map &, const compiler_options &)"
                 );
  }
  if (iVar2 == 1) {
    pvVar4 = std::
             vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
             ::back(&prim->arguments);
    compile_expression(fns,env,rd,data,code,pvVar4,pm,options,RAX,true);
  }
  else if (1 < iVar2) {
    __range4._7_1_ = (bool)(options->fast_expression_targetting & 1);
    __end4 = std::
             vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
             ::begin(&prim->arguments);
    expr = (variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
            *)std::
              vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
              ::end(&prim->arguments);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                                       *)&expr), bVar1) {
      pvStack_78 = __gnu_cxx::
                   __normal_iterator<const_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                   ::operator*(&__end4);
      bVar1 = expression_can_be_targetted(pvStack_78);
      __range4._7_1_ = (__range4._7_1_ & bVar1) != 0;
      __gnu_cxx::
      __normal_iterator<const_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
      ::operator++(&__end4);
    }
    if (__range4._7_1_ == false) {
      bVar1 = std::
              vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
              ::empty(&prim->arguments);
      if (!bVar1) {
        for (local_88 = 0; local_88 < (ulong)(long)(iVar2 + -1); local_88 = local_88 + 1) {
          pvVar4 = std::
                   vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                   ::operator[](&prim->arguments,local_88);
          compile_expression(fns,env,rd,data,code,pvVar4,pm,options,RAX,true);
          push(code,RAX);
        }
        pvVar4 = std::
                 vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                 ::back(&prim->arguments);
        compile_expression(fns,env,rd,data,code,pvVar4,pm,options,RAX,true);
        i_2 = 0x40;
        pvVar5 = std::
                 vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
                 operator[](&compile_prim_call_inlined::args,(long)(iVar2 + -1));
        local_90 = RAX;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand&,assembler::asmcode::operand>
                  (code,(operation *)&i_2,pvVar5,&local_90);
        for (inlined_pm_it._M_node._4_4_ = iVar2 + -2; -1 < inlined_pm_it._M_node._4_4_;
            inlined_pm_it._M_node._4_4_ = inlined_pm_it._M_node._4_4_ + -1) {
          pvVar5 = std::
                   vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                   ::operator[](&compile_prim_call_inlined::args,(long)inlined_pm_it._M_node._4_4_);
          pop(code,*pvVar5);
        }
      }
    }
    else {
      while (i_1._4_4_ = iVar2 + -1, -1 < i_1._4_4_) {
        pvVar4 = std::
                 vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                 ::operator[](&prim->arguments,(long)i_1._4_4_);
        pvVar5 = std::
                 vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
                 operator[](&compile_prim_call_inlined::args,(long)i_1._4_4_);
        compile_expression(fns,env,rd,data,code,pvVar4,pm,options,*pvVar5,false);
        iVar2 = i_1._4_4_;
      }
    }
  }
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>_>_>
       ::find(fns->inlined_primitives,&prim->primitive_name);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>_>_>
       ::end(fns->inlined_primitives);
  bVar1 = std::operator==(&local_a0,&local_a8);
  if (bVar1) {
    iVar2 = prim->line_nr;
    column_nr = prim->column_nr;
    std::__cxx11::string::string((string *)&local_c8,(string *)&prim->primitive_name);
    throw_error(iVar2,column_nr,&prim->filename,primitive_unknown,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  local_cc = COMMENT;
  ppVar6 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>_>
           ::operator->(&local_a0);
  std::operator+(&local_f0,"inlining ",&ppVar6->first);
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string>
            (code,&local_cc,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  ppVar6 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>_>
           ::operator->(&local_a0);
  (*ppVar6->second)(code,options);
  return;
}

Assistant:

void compile_prim_call_inlined(registered_functions& fns, environment_map& env, repl_data& rd, compile_data& data, asmcode& code, const PrimitiveCall& prim, const primitive_map& pm, const compiler_options& options)
    {
    assert(is_inlined_primitive(prim.primitive_name));

    static std::vector<asmcode::operand> args = get_inlined_args();

    int nr_prim_args = (int)prim.arguments.size();

    assert(nr_prim_args <= args.size());

    if (nr_prim_args == 1)
      {
      compile_expression(fns, env, rd, data, code, prim.arguments.back(), pm, options);
      }
    else if (nr_prim_args > 1)
      {
      bool expressions_can_be_targetted = options.fast_expression_targetting;
      for (const auto& expr : prim.arguments)
        expressions_can_be_targetted &= expression_can_be_targetted(expr);

      if (expressions_can_be_targetted)
        {
        for (int i = nr_prim_args - 1; i >= 0; --i)
          compile_expression(fns, env, rd, data, code, prim.arguments[i], pm, options, args[i], false); // since we are going backwards, we cannot expire intervals. It is safe to go backwards, as the expressions are simple
        }
      else
        {
        if (!prim.arguments.empty())
          {
          for (size_t i = 0; i < nr_prim_args - 1; ++i)
            {
            compile_expression(fns, env, rd, data, code, prim.arguments[i], pm, options);
            //code.add(asmcode::PUSH, asmcode::RAX);
            push(code, asmcode::RAX);
            }
          compile_expression(fns, env, rd, data, code, prim.arguments.back(), pm, options);
          code.add(asmcode::MOV, args[nr_prim_args - 1], asmcode::RAX);
          for (int i = nr_prim_args - 2; i >= 0; --i)
            {
            //code.add(asmcode::POP, args[i]);
            pop(code, args[i]);
            }
          }
        }
      }

    auto inlined_pm_it = fns.inlined_primitives->find(prim.primitive_name);
    if (inlined_pm_it == fns.inlined_primitives->end())
      throw_error(prim.line_nr, prim.column_nr, prim.filename, primitive_unknown, prim.primitive_name);
    code.add(asmcode::COMMENT, "inlining " + inlined_pm_it->first);

    inlined_pm_it->second(code, options);
    }